

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall
testing::internal::ExecDeathTest::ExecDeathTest
          (ExecDeathTest *this,char *a_statement,
          Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *matcher,char *file,int line)

{
  ForkingDeathTest *in_RCX;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_RDX;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffff88;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher(in_RDX,in_stack_ffffffffffffff88);
  ForkingDeathTest::ForkingDeathTest
            (in_RCX,(char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0);
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            *)0x159d5d);
  *in_RDI = &PTR__ExecDeathTest_0019c338;
  in_RDI[8] = in_RCX;
  *(undefined4 *)(in_RDI + 9) = in_R8D;
  return;
}

Assistant:

ExecDeathTest(const char* a_statement, Matcher<const std::string&> matcher,
                const char* file, int line)
      : ForkingDeathTest(a_statement, std::move(matcher)),
        file_(file),
        line_(line) {}